

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O3

uint32 __thiscall Clasp::Asp::RuleTransform::Impl::transformSelect(Impl *this,Atom_t h)

{
  size_type sVar1;
  pointer pWVar2;
  pointer plVar3;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  size_type sVar7;
  ulong uVar8;
  long lVar9;
  uint *puVar10;
  uint uVar11;
  uint32 local_6c;
  Atom_t local_64;
  AtomSpan local_60;
  ulong local_50;
  LitVec *local_48;
  LitSpan local_40;
  
  local_48 = &this->lits_;
  uVar5 = 0;
  (this->lits_).ebo_.size = 0;
  (this->aux_).ebo_.size = 0;
  sVar1 = (this->agg_).ebo_.size;
  iVar6 = this->bound_;
  local_50 = (ulong)(h != 0);
  lVar9 = 0;
  uVar8 = 0;
  local_6c = 0;
  while( true ) {
    if (lVar9 < iVar6) {
      do {
        pWVar2 = (this->agg_).ebo_.buf;
        lVar9 = lVar9 + pWVar2[uVar8].weight;
        local_60.first._0_4_ = pWVar2[uVar8].lit;
        bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(local_48,(int *)&local_60);
        local_60.first = (uint *)CONCAT44(local_60.first._4_4_,(int)uVar8);
        uVar8 = (ulong)((int)uVar8 + 1);
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->aux_,(uint *)&local_60);
      } while (lVar9 < this->bound_);
      uVar5 = (this->lits_).ebo_.size;
    }
    if (uVar5 == 0) {
      local_40.first = (pointer)0x0;
    }
    else {
      local_40.first = (this->lits_).ebo_.buf;
    }
    local_40.size = (size_t)uVar5;
    local_60.first = &local_64;
    local_60.size = local_50;
    local_64 = h;
    uVar4 = addRule(this,(Head_t)0x0,&local_60,&local_40);
    local_6c = local_6c + uVar4;
    sVar7 = (this->aux_).ebo_.size;
    if (sVar7 == 0) break;
    uVar5 = (this->lits_).ebo_.size;
    pWVar2 = (this->agg_).ebo_.buf;
    plVar3 = (this->sumR_).ebo_.buf;
    iVar6 = this->bound_;
    uVar8 = (ulong)(sVar7 - 1);
    puVar10 = (this->aux_).ebo_.buf + uVar8;
    while( true ) {
      uVar5 = uVar5 - 1;
      uVar11 = *puVar10;
      sVar7 = (size_type)uVar8;
      (this->aux_).ebo_.size = sVar7;
      (this->lits_).ebo_.size = uVar5;
      lVar9 = lVar9 - pWVar2[uVar11].weight;
      uVar11 = uVar11 + 1;
      uVar8 = (ulong)uVar11;
      if ((uVar11 != sVar1) && ((long)iVar6 <= plVar3[uVar11] + lVar9)) break;
      puVar10 = puVar10 + -1;
      uVar8 = (ulong)(sVar7 - 1);
      if (sVar7 == 0) {
        return local_6c;
      }
    }
  }
  return local_6c;
}

Assistant:

uint32 RuleTransform::Impl::transformSelect(Atom_t h) {
	lits_.clear();
	uint32 nRule = 0;
	wsum_t cw = 0;
	assert(sumR_[0] >= bound_ && cw < bound_);
	aux_.clear();
	for (uint32 it = 0, end = (uint32)agg_.size();;) {
		while (cw < bound_) {
			cw += Potassco::weight(agg_[it]);
			lits_.push_back(Potassco::lit(agg_[it]));
			aux_.push_back(it++);
		}
		nRule += addRule(h, Potassco::toSpan(lits_));
		do {
			if (aux_.empty()) { return nRule; }
			it = aux_.back();
			aux_.pop_back();
			lits_.pop_back();
			cw -= Potassco::weight(agg_[it]);
		} while (++it == end || (cw + sumR_[it]) < bound_);
	}
}